

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O1

UINT8 __thiscall GYMPlayer::UnloadFile(GYMPlayer *this)

{
  pointer pGVar1;
  UINT8 UVar2;
  void *local_28;
  undefined8 uStack_20;
  long local_18;
  
  UVar2 = 0xff;
  if ((this->_playState & 1) == 0) {
    this->_playState = '\0';
    this->_dLoad = (DATA_LOADER *)0x0;
    this->_fileData = (UINT8 *)0x0;
    local_18 = 0;
    local_28 = (void *)0x0;
    uStack_20 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&this->_decFData,&local_28);
    if (local_28 != (void *)0x0) {
      operator_delete(local_28,local_18 - (long)local_28);
    }
    (this->_fileHdr).hasHeader = '\0';
    (this->_fileHdr).dataOfs = 0;
    pGVar1 = (this->_devices).
             super__Vector_base<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_devices).
        super__Vector_base<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>._M_impl.
        super__Vector_impl_data._M_finish != pGVar1) {
      (this->_devices).
      super__Vector_base<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>._M_impl.
      super__Vector_impl_data._M_finish = pGVar1;
    }
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

UINT8 GYMPlayer::UnloadFile(void)
{
	if (_playState & PLAYSTATE_PLAY)
		return 0xFF;
	
	_playState = 0x00;
	_dLoad = NULL;
	_fileData = NULL;
	_decFData = std::vector<UINT8>();	// free allocated memory
	_fileHdr.hasHeader = 0;
	_fileHdr.dataOfs = 0x00;
	_devices.clear();
	
	return 0x00;
}